

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint extraout_EAX;
  ulong uVar5;
  int *piVar6;
  ulong *puVar7;
  int queryPlayback;
  long lVar8;
  int iVar9;
  ulong numFrames;
  char *format;
  uint uVar10;
  pollfd *pfds;
  int xrun;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  PaError local_78;
  int local_74;
  ulong *local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  int local_54;
  int *local_50;
  PaAlsaStreamComponent *local_48;
  pollfd *local_40;
  PaAlsaStreamComponent *local_38;
  
  local_64 = (uint)((self->playback).pcm != (snd_pcm_t *)0x0);
  local_68 = (uint)((self->capture).pcm != (snd_pcm_t *)0x0);
  local_54 = self->pollTimeout;
  local_74 = 0;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xf0e,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  local_70 = framesAvail;
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_68,local_64,framesAvail,&local_74);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
                       );
      local_78 = paUtilErr_;
      puVar7 = framesAvail;
      iVar9 = local_74;
      goto LAB_001133b8;
    }
    puVar7 = local_70;
    iVar9 = local_74;
    if (local_74 != 0) {
      local_78 = -0x2702;
      if (*framesAvail != 0) {
        local_78 = 0;
      }
      goto LAB_001133b8;
    }
    if (*framesAvail != 0) {
      if ((self->capture).pcm != (snd_pcm_t *)0x0) {
        (self->capture).ready = 1;
      }
      local_78 = 0;
      if ((self->playback).pcm != (snd_pcm_t *)0x0) {
        (self->playback).ready = 1;
      }
      goto LAB_001133b8;
    }
  }
  local_48 = &self->capture;
  local_78 = 0;
  local_50 = xrunOccurred;
  if (local_64 != 0 || local_68 != 0) {
    local_38 = &self->playback;
    local_78 = 0;
    local_60 = 0;
LAB_0011302f:
    uVar3 = local_64;
    uVar2 = local_68;
    pthread_testcancel();
    if (uVar2 == 0) {
      pfds = (pollfd *)0x0;
      uVar10 = 0;
LAB_00113097:
      if (uVar3 == 0) {
        local_40 = (pollfd *)0x0;
      }
      else {
        if (uVar2 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)(self->capture).nfds;
        }
        local_40 = self->pfds + uVar5;
        uVar4 = snd_pcm_poll_descriptors((self->playback).pcm,local_40,(self->playback).nfds);
        if (uVar4 != (self->playback).nfds) {
          local_74 = 1;
          lVar8 = 5;
          goto LAB_001132ec;
        }
        (self->playback).ready = 0;
        uVar10 = uVar10 + (self->playback).nfds;
      }
      if (self->callbackMode != 0) {
        pthread_setcancelstate(0,(int *)0x0);
      }
      uVar10 = poll((pollfd *)self->pfds,(long)(int)uVar10,local_54);
      uVar4 = uVar10;
      if (self->callbackMode != 0) {
        uVar4 = pthread_setcancelstate(1,(int *)0x0);
      }
      if ((int)uVar10 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 != 4) {
          paUtilErr_ = -0x2702;
          format = 
          "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3943\n"
          ;
          goto LAB_00113244;
        }
        Pa_Sleep(1);
        lVar8 = 6;
        uVar4 = extraout_EAX;
      }
      else if (uVar10 == 0) {
        if (0 < (int)local_60) {
          Pa_Sleep(1);
        }
        iVar9 = (int)local_60;
        uVar4 = iVar9 + 1;
        local_60 = (ulong)uVar4;
        if (iVar9 < 0x7ff) {
LAB_00113263:
          lVar8 = 0;
          if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
             ((self->playback).pcm != (snd_pcm_t *)0x0)) {
            if (local_64 == 0 && local_68 != 0) {
              lVar8 = 0;
              paUtilErr_ = ContinuePoll(self,StreamDirection_In,&local_54,(int *)&local_68);
              uVar4 = paUtilErr_;
              if (paUtilErr_ < 0) {
                format = 
                "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3999\n"
                ;
                goto LAB_00113244;
              }
            }
            else {
              uVar4 = CONCAT31((int3)(local_68 >> 8),local_68 != 0 || local_64 == 0);
              if ((local_68 == 0 && local_64 != 0) &&
                 (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&local_54,(int *)&local_64),
                 lVar8 = 0, uVar4 = paUtilErr_, paUtilErr_ < 0)) {
                format = 
                "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4003\n"
                ;
                goto LAB_00113244;
              }
            }
          }
        }
        else {
          *local_70 = 0;
          local_74 = 1;
          local_78 = -0x2703;
          lVar8 = 5;
        }
      }
      else {
        if ((uVar2 == 0) ||
           (uVar4 = PaAlsaStreamComponent_EndPolling(local_48,pfds,(int *)&local_68,&local_74),
           paUtilErr_ = uVar4, -1 < (int)uVar4)) {
          if ((uVar3 == 0) ||
             (uVar4 = PaAlsaStreamComponent_EndPolling(local_38,local_40,(int *)&local_64,&local_74)
             , paUtilErr_ = uVar4, -1 < (int)uVar4)) {
            local_60 = 0;
            lVar8 = 7;
            if (local_74 == 0) goto LAB_00113263;
            goto LAB_001132ec;
          }
          local_60 = 0;
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3983\n"
          ;
        }
        else {
          local_60 = 0;
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3979\n"
          ;
        }
LAB_00113244:
        PaUtil_DebugPrint(format);
        lVar8 = 4;
        local_78 = paUtilErr_;
        uVar4 = paUtilErr_;
      }
    }
    else {
      pfds = self->pfds;
      uVar4 = snd_pcm_poll_descriptors((self->capture).pcm,pfds,(self->capture).nfds);
      if (uVar4 == (self->capture).nfds) {
        (self->capture).ready = 0;
        uVar10 = (self->capture).nfds;
        goto LAB_00113097;
      }
      local_74 = 1;
      lVar8 = 5;
    }
LAB_001132ec:
    if (7 < (uint)lVar8) {
switchD_00113305_caseD_1:
      return uVar4;
    }
    uVar4 = (&switchD_00113305::switchdataD_00117ce8)[lVar8] + 0x117ce8;
    switch(lVar8) {
    case 0:
    case 6:
      goto switchD_00113305_caseD_0;
    default:
      goto switchD_00113305_caseD_1;
    case 4:
    case 5:
      goto switchD_00113305_caseD_4;
    case 7:
      break;
    }
  }
switchD_00113305_caseD_7:
  xrunOccurred = local_50;
  if (local_74 == 0) {
    queryPlayback = 0;
    iVar9 = 0;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      iVar9 = (self->capture).ready;
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      queryPlayback = (self->playback).ready;
    }
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar9,queryPlayback,local_70,&local_74);
    puVar7 = local_70;
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4017\n"
                       );
      puVar7 = local_70;
      local_78 = paUtilErr_;
      iVar9 = local_74;
    }
    else {
      psVar1 = (self->capture).pcm;
      iVar9 = local_74;
      if (psVar1 != (snd_pcm_t *)0x0) {
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          if (((self->playback).ready == 0) && (self->neverDropInput == 0)) {
            if ((self->capture).ready == 0) {
              __assert_fail("self->capture.ready",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xfb8,
                            "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            uVar5 = (self->capture).framesPerPeriod;
            numFrames = *local_70;
            if (uVar5 < *local_70) {
              numFrames = uVar5;
            }
            PaAlsaStreamComponent_EndProcessing(local_48,numFrames,&local_74);
            *puVar7 = 0;
            (self->capture).ready = 0;
            iVar9 = local_74;
          }
          goto LAB_001133b8;
        }
        if (psVar1 != (snd_pcm_t *)0x0) {
          if ((self->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xfc0,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
          goto LAB_001133b8;
        }
      }
      if ((self->playback).ready == 0) {
        __assert_fail("self->playback.ready",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xfc2,
                      "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
      }
    }
  }
  else {
switchD_00113305_caseD_4:
    puVar7 = local_70;
    iVar9 = local_74;
    xrunOccurred = local_50;
  }
LAB_001133b8:
  while( true ) {
    while (iVar9 == 0) {
      if (((*puVar7 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
      goto LAB_00113426;
      PaUtil_DebugPrint(
                       "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4050\n"
                       );
      local_78 = -0x2702;
      puVar7 = local_70;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(self);
    if (-1 < paUtilErr_) break;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4042\n"
                     );
    local_78 = paUtilErr_;
    puVar7 = local_70;
  }
  *local_70 = 0;
LAB_00113426:
  *xrunOccurred = iVar9;
  return local_78;
switchD_00113305_caseD_0:
  if (local_68 == 0 && local_64 == 0) goto switchD_00113305_caseD_7;
  goto LAB_0011302f;
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            if(*framesAvail == 0)
            {
                result = paInternalError;
            }
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PaError res = PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds );
            if( res != paNoError)
            {
                xrun = 1;
                goto end;
            }
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PaError res = PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds );
            if( res != paNoError)
            {
                xrun = 1;
                goto end;
            }
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }
            result = paInternalError;

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                result = paTimedOut;
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}